

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParserNsLookup(xmlParserCtxtPtr ctxt,xmlHashedString *prefix,xmlParserNsBucket **bucketPtr)

{
  xmlParserNsBucket *local_48;
  uint local_3c;
  uint hashValue;
  uint index;
  xmlParserNsBucket *tombstone;
  xmlParserNsBucket *bucket;
  xmlParserNsBucket **bucketPtr_local;
  xmlHashedString *prefix_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (prefix->name == (xmlChar *)0x0) {
    ctxt_local._4_4_ = ctxt->nsdb->defaultNsIndex;
  }
  else if (ctxt->nsdb->hashSize == 0) {
    ctxt_local._4_4_ = 0x7fffffff;
  }
  else {
    local_3c = prefix->hashValue & ctxt->nsdb->hashSize - 1;
    tombstone = ctxt->nsdb->hash + local_3c;
    _hashValue = (xmlParserNsBucket *)0x0;
    while (tombstone->hashValue != 0) {
      if (tombstone->index == 0x7fffffff) {
        if (_hashValue == (xmlParserNsBucket *)0x0) {
          _hashValue = tombstone;
        }
      }
      else if ((tombstone->hashValue == prefix->hashValue) &&
              (ctxt->nsTab[tombstone->index << 1] == prefix->name)) {
        if (bucketPtr != (xmlParserNsBucket **)0x0) {
          *bucketPtr = tombstone;
        }
        return tombstone->index;
      }
      local_3c = local_3c + 1;
      tombstone = tombstone + 1;
      if (local_3c == ctxt->nsdb->hashSize) {
        local_3c = 0;
        tombstone = ctxt->nsdb->hash;
      }
    }
    if (bucketPtr != (xmlParserNsBucket **)0x0) {
      if (_hashValue == (xmlParserNsBucket *)0x0) {
        local_48 = tombstone;
      }
      else {
        local_48 = _hashValue;
      }
      *bucketPtr = local_48;
    }
    ctxt_local._4_4_ = 0x7fffffff;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlParserNsLookup(xmlParserCtxtPtr ctxt, const xmlHashedString *prefix,
                  xmlParserNsBucket **bucketPtr) {
    xmlParserNsBucket *bucket, *tombstone;
    unsigned index, hashValue;

    if (prefix->name == NULL)
        return(ctxt->nsdb->defaultNsIndex);

    if (ctxt->nsdb->hashSize == 0)
        return(INT_MAX);

    hashValue = prefix->hashValue;
    index = hashValue & (ctxt->nsdb->hashSize - 1);
    bucket = &ctxt->nsdb->hash[index];
    tombstone = NULL;

    while (bucket->hashValue) {
        if (bucket->index == INT_MAX) {
            if (tombstone == NULL)
                tombstone = bucket;
        } else if (bucket->hashValue == hashValue) {
            if (ctxt->nsTab[bucket->index * 2] == prefix->name) {
                if (bucketPtr != NULL)
                    *bucketPtr = bucket;
                return(bucket->index);
            }
        }

        index++;
        bucket++;
        if (index == ctxt->nsdb->hashSize) {
            index = 0;
            bucket = ctxt->nsdb->hash;
        }
    }

    if (bucketPtr != NULL)
        *bucketPtr = tombstone ? tombstone : bucket;
    return(INT_MAX);
}